

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

void __thiscall helics::ActionMessage::ActionMessage(ActionMessage *this,string *bytes)

{
  string_view data;
  
  ActionMessage(this);
  data._M_str = (bytes->_M_dataplus)._M_p;
  data._M_len = bytes->_M_string_length;
  from_string(this,data);
  return;
}

Assistant:

ActionMessage::ActionMessage(const std::string& bytes): ActionMessage()
{
    from_string(bytes);
}